

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_find(btree *btree,void *key,void *value_buf)

{
  ushort uVar1;
  _func_voidref_void_ptr_bid_t *p_Var2;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var3;
  void *pvVar4;
  code *pcVar5;
  _func_bid_t_void_ptr *p_Var6;
  _func_void_void_ptr *p_Var7;
  void *pvVar8;
  idx_t iVar9;
  int iVar10;
  voidref addr;
  bnode *node;
  bid_t bVar11;
  btree_print_func *pbVar12;
  long lVar13;
  void *pvVar14;
  btree_result bVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uStack_60;
  void *local_58;
  void *local_50;
  void *local_48;
  long local_40;
  void *local_38;
  
  pvVar16 = (void *)((long)&local_58 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  pvVar14 = (void *)((long)pvVar16 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  uVar1 = btree->height;
  lVar13 = (long)pvVar14 - (ulong)((uint)uVar1 * 8 + 0xf & 0xfffffff0);
  pbVar12 = btree->kv_ops->init_kv_var;
  local_58 = value_buf;
  local_50 = key;
  local_40 = lVar13;
  local_38 = pvVar14;
  if (pbVar12 != (btree_print_func *)0x0) {
    *(undefined8 *)(lVar13 + -8) = 0x11ecfb;
    (*pbVar12)(btree,pvVar16,pvVar14);
    uVar1 = btree->height;
  }
  pvVar14 = local_38;
  *(bid_t *)(local_40 + -8 + (ulong)uVar1 * 8) = btree->root_bid;
  uVar18 = (ulong)uVar1;
  local_48 = pvVar16;
  do {
    uVar17 = uVar18 - 1;
    if (uVar18 == 0) {
      p_Var7 = btree->blk_ops->blk_operation_end;
      if (p_Var7 != (_func_void_void_ptr *)0x0) {
        pvVar14 = btree->blk_handle;
        *(undefined8 *)(lVar13 + -8) = 0x11edf3;
        (*p_Var7)(pvVar14);
      }
      pbVar12 = btree->kv_ops->free_kv_var;
      bVar15 = BTREE_RESULT_SUCCESS;
LAB_0011edfe:
      pvVar16 = local_38;
      pvVar14 = local_48;
      if (pbVar12 != (btree_print_func *)0x0) {
        *(undefined8 *)(lVar13 + -8) = 0x11ee10;
        (*pbVar12)(btree,pvVar14,pvVar16);
      }
      return bVar15;
    }
    pvVar16 = btree->blk_handle;
    bVar11 = *(bid_t *)(local_40 + uVar17 * 8);
    p_Var2 = btree->blk_ops->blk_read;
    *(undefined8 *)(lVar13 + -8) = 0x11ed35;
    addr = (*p_Var2)(pvVar16,bVar11);
    *(undefined8 *)(lVar13 + -8) = 0x11ed44;
    node = _fetch_bnode(btree,addr,(uint16_t)uVar18);
    pvVar16 = local_50;
    *(undefined8 *)(lVar13 + -8) = 0x11ed56;
    iVar9 = _btree_find_entry(btree,node,pvVar16);
    pvVar16 = local_48;
    if (iVar9 == 0xffff) {
LAB_0011edc3:
      p_Var7 = btree->blk_ops->blk_operation_end;
      if (p_Var7 != (_func_void_void_ptr *)0x0) {
        pvVar14 = btree->blk_handle;
        *(undefined8 *)(lVar13 + -8) = 0x11edd6;
        (*p_Var7)(pvVar14);
      }
      pbVar12 = btree->kv_ops->free_kv_var;
      *(undefined8 *)(lVar13 + -8) = 2;
      bVar15 = (btree_result)*(undefined8 *)(lVar13 + -8);
      goto LAB_0011edfe;
    }
    p_Var3 = btree->kv_ops->get_kv;
    *(undefined8 *)(lVar13 + -8) = 0x11ed73;
    (*p_Var3)(node,iVar9,pvVar16,pvVar14);
    pvVar8 = local_50;
    if (uVar18 == 1) {
      pvVar4 = btree->aux;
      pcVar5 = (code *)btree->kv_ops->cmp;
      *(undefined8 *)(lVar13 + -8) = 0x11ed8b;
      iVar10 = (*pcVar5)(pvVar8,pvVar16,pvVar4);
      pvVar8 = local_38;
      pvVar16 = local_58;
      if (iVar10 != 0) goto LAB_0011edc3;
      pbVar12 = btree->kv_ops->set_value;
      *(undefined8 *)(lVar13 + -8) = 0x11eda1;
      (*pbVar12)(btree,pvVar16,pvVar8);
      uVar18 = uVar17;
    }
    else {
      p_Var6 = btree->kv_ops->value2bid;
      *(undefined8 *)(lVar13 + -8) = 0x11edaf;
      bVar11 = (*p_Var6)(pvVar14);
      *(bid_t *)(local_40 + -8 + uVar17 * 8) =
           bVar11 >> 0x38 | (bVar11 & 0xff000000000000) >> 0x28 | (bVar11 & 0xff0000000000) >> 0x18
           | (bVar11 & 0xff00000000) >> 8 | (bVar11 & 0xff000000) << 8 | (bVar11 & 0xff0000) << 0x18
           | (bVar11 & 0xff00) << 0x28 | bVar11 << 0x38;
      uVar18 = uVar17;
    }
  } while( true );
}

Assistant:

btree_result btree_find(struct btree *btree, void *key, void *value_buf)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t *idx = alca(idx_t, btree->height);
    bid_t *bid = alca(bid_t, btree->height);
    struct bnode **node = alca(struct bnode *, btree->height);
    int i;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);

    // set root
    bid[btree->height-1] = btree->root_bid;

    for (i=btree->height-1; i>=0; --i) {
        // read block using bid
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid[i]);
        // fetch node structure from block
        node[i] = _fetch_bnode(btree, addr, i+1);

        // lookup key in current node
        idx[i] = _btree_find_entry(btree, node[i], key);

        if (idx[i] == BTREE_IDX_NOT_FOUND) {
            // not found .. return NULL
            if (btree->blk_ops->blk_operation_end)
                btree->blk_ops->blk_operation_end(btree->blk_handle);
            if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
            return BTREE_RESULT_FAIL;
        }

        btree->kv_ops->get_kv(node[i], idx[i], k, v);

        if (i>0) {
            // index (non-leaf) node
            // get bid of child node from value
            bid[i-1] = btree->kv_ops->value2bid(v);
            bid[i-1] = _endian_decode(bid[i-1]);
        }else{
            // leaf node
            // return (address of) value if KEY == k
            if (!btree->kv_ops->cmp(key, k, btree->aux)) {
                btree->kv_ops->set_value(btree, value_buf, v);
            }else{
                if (btree->blk_ops->blk_operation_end)
                    btree->blk_ops->blk_operation_end(btree->blk_handle);
                if (btree->kv_ops->free_kv_var) {
                    btree->kv_ops->free_kv_var(btree, k, v);
                }
                return BTREE_RESULT_FAIL;
            }
        }
    }
    if (btree->blk_ops->blk_operation_end) {
        btree->blk_ops->blk_operation_end(btree->blk_handle);
    }
    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}